

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu_dlib.cpp
# Opt level: O0

void dlib::cpu::tanh_gradient(tensor *grad,tensor *dest,tensor *gradient_input)

{
  type_conflict3 tVar1;
  int iVar2;
  undefined4 extraout_var;
  long lVar4;
  undefined4 extraout_var_01;
  size_t sVar5;
  tensor *in_RDX;
  tensor *in_RSI;
  tensor *in_RDI;
  size_t i_1;
  size_t i;
  float *in;
  float *d;
  float *g;
  ulong local_40;
  ulong local_38;
  long lVar3;
  undefined4 extraout_var_00;
  
  iVar2 = (*in_RDI->_vptr_tensor[3])();
  lVar3 = CONCAT44(extraout_var,iVar2);
  iVar2 = (*in_RSI->_vptr_tensor[2])();
  lVar4 = CONCAT44(extraout_var_00,iVar2);
  iVar2 = (*in_RDX->_vptr_tensor[2])();
  tVar1 = is_same_object<dlib::tensor,dlib::tensor>(in_RDI,in_RDX);
  if (tVar1) {
    for (local_38 = 0; sVar5 = tensor::size(in_RSI), local_38 < sVar5; local_38 = local_38 + 1) {
      *(float *)(lVar3 + local_38 * 4) =
           *(float *)(CONCAT44(extraout_var_01,iVar2) + local_38 * 4) *
           (-*(float *)(lVar4 + local_38 * 4) * *(float *)(lVar4 + local_38 * 4) + 1.0);
    }
  }
  else {
    for (local_40 = 0; sVar5 = tensor::size(in_RSI), local_40 < sVar5; local_40 = local_40 + 1) {
      *(float *)(lVar3 + local_40 * 4) =
           *(float *)(CONCAT44(extraout_var_01,iVar2) + local_40 * 4) *
           (-*(float *)(lVar4 + local_40 * 4) * *(float *)(lVar4 + local_40 * 4) + 1.0) +
           *(float *)(lVar3 + local_40 * 4);
    }
  }
  return;
}

Assistant:

void tanh_gradient (
            tensor& grad,
            const tensor& dest,
            const tensor& gradient_input
        )
        {
            const auto g = grad.host();
            const auto d = dest.host();
            const auto in = gradient_input.host();
            if (is_same_object(grad, gradient_input))
            {
                for (size_t i = 0; i < dest.size(); ++i)
                    g[i] = in[i]*(1-d[i]*d[i]);
            }
            else
            {
                for (size_t i = 0; i < dest.size(); ++i)
                    g[i] += in[i]*(1-d[i]*d[i]);
            }
        }